

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktRenderPassTests.cpp
# Opt level: O1

void __thiscall
vkt::anon_unknown_0::Subpass::Subpass
          (Subpass *this,VkPipelineBindPoint pipelineBindPoint,VkSubpassDescriptionFlags flags,
          vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          *inputAttachments,
          vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          *colorAttachments,
          vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
          *resolveAttachments,AttachmentReference depthStencilAttachment,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *preserveAttachments)

{
  undefined4 in_register_00000014;
  undefined4 in_register_00000034;
  
  this->m_pipelineBindPoint = VK_PIPELINE_BIND_POINT_GRAPHICS;
  this->m_flags = 0;
  std::
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ::vector(&this->m_inputAttachments,
           (vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            *)CONCAT44(in_register_00000034,pipelineBindPoint));
  std::
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ::vector(&this->m_colorAttachments,
           (vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
            *)CONCAT44(in_register_00000014,flags));
  std::
  vector<vkt::(anonymous_namespace)::AttachmentReference,_std::allocator<vkt::(anonymous_namespace)::AttachmentReference>_>
  ::vector(&this->m_resolveAttachments,inputAttachments);
  this->m_depthStencilAttachment = (AttachmentReference)colorAttachments;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
            (&this->m_preserveAttachments,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)resolveAttachments);
  return;
}

Assistant:

Subpass						(VkPipelineBindPoint				pipelineBindPoint,
																	 VkSubpassDescriptionFlags			flags,
																	 const vector<AttachmentReference>&	inputAttachments,
																	 const vector<AttachmentReference>&	colorAttachments,
																	 const vector<AttachmentReference>&	resolveAttachments,
																	 AttachmentReference				depthStencilAttachment,
																	 const vector<deUint32>&			preserveAttachments)
		: m_pipelineBindPoint		(pipelineBindPoint)
		, m_flags					(flags)
		, m_inputAttachments		(inputAttachments)
		, m_colorAttachments		(colorAttachments)
		, m_resolveAttachments		(resolveAttachments)
		, m_depthStencilAttachment	(depthStencilAttachment)
		, m_preserveAttachments		(preserveAttachments)
	{
	}